

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMatcher.h
# Opt level: O0

void __thiscall OrderMatcher::erase(OrderMatcher *this,Order *order)

{
  bool bVar1;
  string *__x;
  pointer ppVar2;
  _Self local_28;
  _Self local_20;
  iterator i;
  Order *order_local;
  OrderMatcher *this_local;
  
  i._M_node = (_Base_ptr)order;
  __x = Order::getSymbol_abi_cxx11_(order);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
       ::find(&this->m_markets,__x);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
       ::end(&this->m_markets);
  bVar1 = std::operator==(&local_20,&local_28);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>
             ::operator->(&local_20);
    Market::erase(&ppVar2->second,(Order *)i._M_node);
  }
  return;
}

Assistant:

void erase(const Order &order) {
    Markets::iterator i = m_markets.find(order.getSymbol());
    if (i == m_markets.end()) {
      return;
    }
    i->second.erase(order);
  }